

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O1

uint8_t nibble(char c)

{
  byte bVar1;
  
  if (c < 'a') {
    if (c < 'A') {
      bVar1 = c - 0x30;
      if (9 < bVar1) {
        __assert_fail("c >= \'0\' && c <= \'9\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_spec.cpp"
                      ,0x26,"nibble");
      }
    }
    else {
      if ('F' < c) {
        __assert_fail("c <= \'F\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_spec.cpp"
                      ,0x23,"nibble");
      }
      bVar1 = c - 0x37;
    }
  }
  else {
    if ('f' < c) {
      __assert_fail("c <= \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_spec.cpp"
                    ,0x20,"nibble");
    }
    bVar1 = c + 0xa9;
  }
  return bVar1;
}

Assistant:

constexpr uint8_t nibble(char c) {
	if (c >= 'a') {
		assert(c <= 'f');
		return c - 'a' + 10;
	} else if (c >= 'A') {
		assert(c <= 'F');
		return c - 'A' + 10;
	} else {
		assert(c >= '0' && c <= '9');
		return c - '0';
	}
}